

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argumentUtils.cpp
# Opt level: O1

FactoredDecPOMDPDiscreteInterface *
ArgumentUtils::GetFactoredDecPOMDPDiscreteInterfaceFromArgs(Arguments *args)

{
  FactoredDecPOMDPDiscrete *this;
  ProblemFireFightingFactored *this_00;
  ProblemAloha *this_01;
  ostream *poVar1;
  undefined8 *puVar2;
  Problem_t t;
  Arguments *in_RDX;
  FactoredDecPOMDPDiscreteInterface *pFVar3;
  MADPParser parser;
  string dpomdpFile;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  undefined1 local_1b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0 [23];
  
  switch(args->problem_type) {
  case DT:
  case FF:
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b0);
    ProblemType::SoftPrint_abi_cxx11_(&local_230,(ProblemType *)(ulong)args->problem_type,t);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)(local_1b0 + 0x10),local_230._M_dataplus._M_p,
                        local_230._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," is not factored.",0x11);
    std::endl<char,std::char_traits<char>>(poVar1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
      operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
    }
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x28);
    *puVar2 = &PTR__E_0059bd80;
    std::__cxx11::stringbuf::str();
    __cxa_throw(puVar2,&E::typeinfo,E::~E);
  case FFF:
    this_00 = (ProblemFireFightingFactored *)operator_new(0x790);
    ProblemFireFightingFactored::ProblemFireFightingFactored
              (this_00,args->nrAgents,args->nrHouses,args->nrFLs,0.0,false,1.0,true);
    break;
  case FFG:
    this_00 = (ProblemFireFightingFactored *)operator_new(0x790);
    ProblemFireFightingGraph::ProblemFireFightingGraph
              ((ProblemFireFightingGraph *)this_00,args->nrAgents,args->nrFLs,1.0,true);
    break;
  default:
    directories::MADPGetProblemFilename_abi_cxx11_((string *)local_1b0,(directories *)args,in_RDX);
    this = (FactoredDecPOMDPDiscrete *)operator_new(0x718);
    local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"");
    local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"");
    local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_210,local_1b0._0_8_,(pointer)(local_1b0._0_8_ + local_1b0._8_8_));
    FactoredDecPOMDPDiscrete::FactoredDecPOMDPDiscrete(this,&local_1d0,&local_1f0,&local_210);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
      operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
    }
    MADPParser::Parse((MADPParser *)&local_230,this);
    if (args->marginalize == true) {
      FactoredDecPOMDPDiscrete::MarginalizeStateFactor
                (this,(Index)args->marginalizationIndex,args->sparse != 0);
    }
    else if (args->cache_flat_models == true) {
      (**(code **)(*(long *)&(this->super_MultiAgentDecisionProcessDiscreteFactoredStates).
                             super_MultiAgentDecisionProcess + 0x300))(this,args->sparse != 0);
    }
    pFVar3 = (FactoredDecPOMDPDiscreteInterface *)
             (&(this->super_MultiAgentDecisionProcessDiscreteFactoredStates).
               super_MultiAgentDecisionProcess.field_0x0 +
             *(long *)(*(long *)&(this->super_MultiAgentDecisionProcessDiscreteFactoredStates).
                                 super_MultiAgentDecisionProcess + -0x58));
    if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) {
      operator_delete((void *)local_1b0._0_8_,local_1a0[0]._M_allocated_capacity + 1);
    }
    goto LAB_0038d0c6;
  case Aloha:
    this_01 = (ProblemAloha *)operator_new(0x748);
    ProblemAloha::ProblemAloha
              (this_01,args->islandConf,args->alohaVariation,args->maxBacklog,args->nrAgents,true);
    pFVar3 = (FactoredDecPOMDPDiscreteInterface *)
             (&(this_01->super_FactoredDecPOMDPDiscrete).
               super_MultiAgentDecisionProcessDiscreteFactoredStates.super_MultiAgentDecisionProcess
               .field_0x0 +
             *(long *)(*(long *)&(this_01->super_FactoredDecPOMDPDiscrete).
                                 super_MultiAgentDecisionProcessDiscreteFactoredStates.
                                 super_MultiAgentDecisionProcess + -0x58));
    if (args->cache_flat_models == true) {
      (**(code **)(*(long *)((long)&pFVar3->field_0x0 + *(long *)(*(long *)pFVar3 + -0xf8)) + 0x210)
      )((long)&pFVar3->field_0x0 + *(long *)(*(long *)pFVar3 + -0xf8),args->sparse != 0);
    }
    goto LAB_0038d0c6;
  }
  pFVar3 = (FactoredDecPOMDPDiscreteInterface *)
           (&(this_00->super_FactoredDecPOMDPDiscrete).
             super_MultiAgentDecisionProcessDiscreteFactoredStates.super_MultiAgentDecisionProcess.
             field_0x0 +
           *(long *)(*(long *)&(this_00->super_FactoredDecPOMDPDiscrete).
                               super_MultiAgentDecisionProcessDiscreteFactoredStates.
                               super_MultiAgentDecisionProcess + -0x58));
  if (args->cache_flat_models == true) {
    (**(code **)(*(long *)((long)&pFVar3->field_0x0 + *(long *)(*(long *)pFVar3 + -0xf8)) + 0x210))
              ((long)&pFVar3->field_0x0 + *(long *)(*(long *)pFVar3 + -0xf8),args->sparse != 0);
  }
  if (0 < args->verbose) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"ArgumentUtils: Problem instantiated.",0x24);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
    std::ostream::put(-0x50);
    std::ostream::flush();
  }
LAB_0038d0c6:
  if (0.0 < args->discount) {
    (**(code **)(*(long *)((long)&pFVar3->field_0x0 + *(long *)(*(long *)pFVar3 + -0xb0)) + 0x68))
              ((long)&pFVar3->field_0x0 + *(long *)(*(long *)pFVar3 + -0xb0));
  }
  return pFVar3;
}

Assistant:

FactoredDecPOMDPDiscreteInterface* GetFactoredDecPOMDPDiscreteInterfaceFromArgs(const Arguments& args)
{
    FactoredDecPOMDPDiscreteInterface * dp = 0;
    switch(args.problem_type) 
    {

        case(ProblemType::DT):
        case(ProblemType::FF):
        {
            stringstream ss;
            ss << SoftPrint(args.problem_type) << " is not factored."<< endl;
            throw(E(ss));
            break;
        }
        case(ProblemType::FFF):
        {
            dp = new ProblemFireFightingFactored(args.nrAgents, args.nrHouses, args.nrFLs);
            if(args.cache_flat_models)
                dp->CacheFlatModels(args.sparse);
            if(args.verbose > 0)
                cout << "ArgumentUtils: Problem instantiated." << endl;
            break;
        }
        case(ProblemType::FFG):
        {
            dp = new ProblemFireFightingGraph(args.nrAgents, args.nrFLs);
            if(args.cache_flat_models)
                dp->CacheFlatModels(args.sparse);
            if(args.verbose > 0)
                cout << "ArgumentUtils: Problem instantiated." << endl;
            break;
        }
        case(ProblemType::Aloha):
        {
            dp = new ProblemAloha(
                static_cast<ProblemAloha::IslandConfiguration>(args.islandConf),
                static_cast<ProblemAloha::AlohaVariation>(args.alohaVariation),
                args.maxBacklog,
                args.nrAgents );
            if(args.cache_flat_models)
                dp->CacheFlatModels(args.sparse);
            break;
        }
        case(ProblemType::PARSE):
        default: 
        {   
            string dpomdpFile=directories::MADPGetProblemFilename(args);
            FactoredDecPOMDPDiscrete* decpomdp = 
                new FactoredDecPOMDPDiscrete("", "", dpomdpFile);
            
            MADPParser parser(decpomdp);

            if(args.marginalize)
                decpomdp->MarginalizeStateFactor(args.marginalizationIndex,args.sparse);
            else if(args.cache_flat_models)
                decpomdp->CacheFlatModels(args.sparse);
                
            dp = decpomdp;
            break;
        }
        
    }
    if(args.discount > 0)
        dp->SetDiscount(args.discount);

    return dp;
}